

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_clusterizer.h
# Opt level: O1

void __thiscall
crnlib::clusterizer<crnlib::vec<6U,_float>_>::split_node
          (clusterizer<crnlib::vec<6U,_float>_> *this,uint index)

{
  uint *puVar1;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar2;
  undefined8 *puVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint *puVar7;
  pair<crnlib::vec<6U,_float>,_unsigned_int> *ppVar8;
  void *pvVar9;
  void *p;
  vq_node *pvVar10;
  char cVar11;
  uint i;
  long lVar12;
  int iVar13;
  int iVar14;
  uint node_index;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  uint min_new_capacity;
  ulong uVar18;
  vq_node *pvVar19;
  float dist2;
  float fVar20;
  float fVar21;
  float dist2_1;
  float fVar22;
  float fVar23;
  float fVar24;
  vec<6U,_float> new_right_child;
  vec<6U,_float> new_left_child;
  vec<6U,_float> right_child;
  vec<6U,_float> left_child;
  vec<6U,_float> result;
  float local_118;
  float local_114;
  float local_fc;
  float local_e8 [8];
  float local_c8 [2];
  uint *puStack_c0;
  undefined8 local_b8;
  elemental_vector *local_a8;
  vq_node *local_a0;
  undefined1 local_98 [32];
  undefined1 local_78 [32];
  elemental_vector *local_58;
  elemental_vector *local_50;
  float afStack_48 [6];
  
  pvVar19 = (this->m_nodes).m_p;
  if (pvVar19[index].m_vectors.m_size != 1) {
    pvVar19 = pvVar19 + index;
    if (this->m_quick == true) {
      compute_split_estimate(this,(vec<6U,_float> *)local_78,(vec<6U,_float> *)local_98,pvVar19);
    }
    else {
      compute_split_pca(this,(vec<6U,_float> *)local_78,(vec<6U,_float> *)local_98,pvVar19);
    }
    iVar13 = 8;
    if (this->m_quick != false) {
      iVar13 = 2;
    }
    local_a8 = (elemental_vector *)&this->m_nodes;
    local_50 = (elemental_vector *)&this->m_left_children;
    local_58 = (elemental_vector *)&this->m_right_children;
    local_114 = 0.0;
    local_fc = 1e+10;
    local_118 = 0.0;
    iVar14 = 0;
    local_a0 = pvVar19;
    do {
      if ((this->m_left_children).m_size != 0) {
        (this->m_left_children).m_size = 0;
      }
      if ((this->m_right_children).m_size != 0) {
        (this->m_right_children).m_size = 0;
      }
      local_c8[0] = 0.0;
      local_c8[1] = 0.0;
      puStack_c0 = (uint *)0x0;
      local_b8._0_4_ = 0;
      local_b8._4_4_ = 0;
      local_e8[4] = 0.0;
      local_e8[5] = 0.0;
      local_e8[0] = 0.0;
      local_e8[1] = 0.0;
      local_e8[2] = 0.0;
      local_e8[3] = 0.0;
      if ((pvVar19->m_vectors).m_size == 0) {
        fVar21 = 0.0;
        fVar23 = 0.0;
        uVar15 = 0;
        uVar16 = 0;
      }
      else {
        fVar23 = 0.0;
        uVar18 = 0;
        uVar16 = 0;
        uVar15 = 0;
        fVar21 = 0.0;
        do {
          puVar7 = (pvVar19->m_vectors).m_p;
          ppVar8 = (this->m_training_vecs).m_p;
          ppVar2 = ppVar8 + puVar7[uVar18];
          uVar17 = (ulong)ppVar8[puVar7[uVar18]].second;
          fVar20 = 0.0;
          lVar12 = 0;
          do {
            fVar22 = *(float *)(local_78 + lVar12 * 4) - (ppVar2->first).m_s[lVar12];
            fVar20 = fVar20 + fVar22 * fVar22;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 6);
          fVar22 = 0.0;
          lVar12 = 0;
          do {
            fVar24 = *(float *)(local_98 + lVar12 * 4) - (ppVar2->first).m_s[lVar12];
            fVar22 = fVar22 + fVar24 * fVar24;
            lVar12 = lVar12 + 1;
          } while (lVar12 != 6);
          if (fVar22 <= fVar20) {
            uVar4 = (this->m_right_children).m_size;
            if ((this->m_right_children).m_capacity <= uVar4) {
              elemental_vector::increase_capacity(local_58,uVar4 + 1,true,4,(object_mover)0x0,false)
              ;
              pvVar19 = local_a0;
            }
            (this->m_right_children).m_p[(this->m_right_children).m_size] = puVar7[uVar18];
            puVar1 = &(this->m_right_children).m_size;
            *puVar1 = *puVar1 + 1;
            lVar12 = 0;
            do {
              afStack_48[lVar12] = (ppVar2->first).m_s[lVar12] * (float)uVar17;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 6);
            lVar12 = 0;
            do {
              local_e8[lVar12] = afStack_48[lVar12] + local_e8[lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar12 != 6);
            fVar20 = (ppVar2->first).m_s[0];
            fVar20 = fVar20 * fVar20;
            lVar12 = 1;
            do {
              fVar22 = (ppVar2->first).m_s[lVar12];
              fVar20 = fVar20 + fVar22 * fVar22;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 6);
            uVar15 = uVar15 + uVar17;
            fVar21 = fVar21 + fVar20 * (float)uVar17;
          }
          else {
            uVar4 = (this->m_left_children).m_size;
            if ((this->m_left_children).m_capacity <= uVar4) {
              elemental_vector::increase_capacity(local_50,uVar4 + 1,true,4,(object_mover)0x0,false)
              ;
              pvVar19 = local_a0;
            }
            (this->m_left_children).m_p[(this->m_left_children).m_size] = puVar7[uVar18];
            puVar1 = &(this->m_left_children).m_size;
            *puVar1 = *puVar1 + 1;
            lVar12 = 0;
            do {
              afStack_48[lVar12] = (ppVar2->first).m_s[lVar12] * (float)uVar17;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 6);
            lVar12 = 0;
            do {
              local_c8[lVar12] = afStack_48[lVar12] + local_c8[lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar12 != 6);
            fVar20 = (ppVar2->first).m_s[0];
            fVar20 = fVar20 * fVar20;
            lVar12 = 1;
            do {
              fVar22 = (ppVar2->first).m_s[lVar12];
              fVar20 = fVar20 + fVar22 * fVar22;
              lVar12 = lVar12 + 1;
            } while (lVar12 != 6);
            uVar16 = uVar16 + uVar17;
            fVar23 = fVar23 + fVar20 * (float)uVar17;
          }
          uVar18 = uVar18 + 1;
        } while (uVar18 < (pvVar19->m_vectors).m_size);
      }
      if (uVar16 == 0 || uVar15 == 0) {
        pvVar19->m_unsplittable = true;
        cVar11 = '\x01';
      }
      else {
        fVar20 = local_c8[0] * local_c8[0];
        lVar12 = 1;
        do {
          fVar20 = fVar20 + local_c8[lVar12] * local_c8[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 6);
        local_114 = fVar23 - fVar20 / (float)uVar16;
        fVar23 = local_e8[0] * local_e8[0];
        lVar12 = 1;
        do {
          fVar23 = fVar23 + local_e8[lVar12] * local_e8[lVar12];
          lVar12 = lVar12 + 1;
        } while (lVar12 != 6);
        local_118 = fVar21 - fVar23 / (float)uVar15;
        lVar12 = 0;
        do {
          local_c8[lVar12] = local_c8[lVar12] * (1.0 / (float)uVar16);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 6);
        lVar12 = 0;
        do {
          local_e8[lVar12] = local_e8[lVar12] * (1.0 / (float)uVar15);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 6);
        local_78._16_4_ = (uint)local_b8;
        local_78._20_4_ = local_b8._4_4_;
        local_78._0_4_ = local_c8[0];
        local_78._4_4_ = local_c8[1];
        local_78._8_8_ = puStack_c0;
        local_98._0_4_ = local_e8[0];
        local_98._4_4_ = local_e8[1];
        local_98._8_4_ = local_e8[2];
        local_98._12_4_ = local_e8[3];
        local_98._16_4_ = local_e8[4];
        local_98._20_4_ = local_e8[5];
        fVar21 = local_114 + local_118;
        cVar11 = '\x02';
        if (1e-05 <= fVar21) {
          fVar23 = (local_fc - fVar21) / fVar21;
          if (0.00125 <= fVar23) {
            local_fc = fVar21;
          }
          cVar11 = (fVar23 < 0.00125) * '\x02';
        }
      }
      if (cVar11 != '\0') goto LAB_0013b7e5;
      iVar14 = iVar14 + 1;
    } while (iVar14 != iVar13);
    cVar11 = '\x02';
LAB_0013b7e5:
    if (cVar11 == '\x02') {
      uVar4 = (this->m_nodes).m_size;
      node_index = uVar4 + 1;
      pvVar19->m_left = uVar4;
      pvVar19->m_right = node_index;
      uVar5 = this->m_split_index;
      min_new_capacity = uVar4 + 2;
      pvVar19->m_codebook_index = uVar5;
      this->m_split_index = uVar5 + 1;
      if (uVar4 >> 1 < 0x7fffffff) {
        if ((this->m_nodes).m_capacity < min_new_capacity) {
          elemental_vector::increase_capacity
                    (local_a8,min_new_capacity,false,0x48,
                     vector<crnlib::clusterizer<crnlib::vec<6U,_float>_>::vq_node>::object_mover,
                     false);
        }
        uVar6 = (this->m_nodes).m_size;
        if (min_new_capacity - uVar6 != 0) {
          pvVar19 = (this->m_nodes).m_p;
          lVar12 = 0;
          do {
            puVar3 = (undefined8 *)((long)(&pvVar19[uVar6].m_centroid + 1) + lVar12 + 0x10);
            *puVar3 = 0;
            puVar3[1] = 0;
            puVar3 = (undefined8 *)((long)pvVar19[uVar6].m_centroid.m_s + lVar12);
            *puVar3 = 0;
            puVar3[1] = 0;
            puVar3 = (undefined8 *)((long)pvVar19[uVar6].m_centroid.m_s + lVar12 + 0x10);
            *puVar3 = 0;
            puVar3[1] = 0;
            *(undefined8 *)((long)(&pvVar19[uVar6].m_centroid + 2) + lVar12 + 8) =
                 0xffffffffffffffff;
            *(undefined4 *)((long)(&pvVar19[uVar6].m_centroid + 2) + lVar12 + 0x10) = 0xffffffff;
            *(undefined1 *)((long)(&pvVar19[uVar6].m_centroid + 2) + lVar12 + 0x14) = 0;
            lVar12 = lVar12 + 0x48;
          } while ((ulong)(min_new_capacity - uVar6) * 0x48 != lVar12);
        }
      }
      else {
        pvVar9 = local_a8->m_p;
        lVar12 = 0;
        do {
          p = *(void **)((long)pvVar9 + lVar12 + (ulong)min_new_capacity * 0x48 + 0x28);
          if (p != (void *)0x0) {
            crnlib_free(p);
          }
          lVar12 = lVar12 + 0x48;
        } while (lVar12 != 0x47ffffff70);
      }
      (this->m_nodes).m_size = min_new_capacity;
      pvVar10 = (this->m_nodes).m_p;
      pvVar19 = pvVar10 + uVar4;
      if (pvVar19 != (vq_node *)local_78) {
        lVar12 = 0;
        do {
          (pvVar19->m_centroid).m_s[lVar12] = *(float *)(local_78 + lVar12 * 4);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 6);
      }
      pvVar10 = pvVar10 + node_index;
      pvVar19->m_total_weight = uVar16;
      puVar7 = (pvVar19->m_vectors).m_p;
      (pvVar19->m_vectors).m_p = (this->m_left_children).m_p;
      (this->m_left_children).m_p = puVar7;
      uVar5 = (pvVar19->m_vectors).m_size;
      (pvVar19->m_vectors).m_size = (this->m_left_children).m_size;
      (this->m_left_children).m_size = uVar5;
      uVar5 = (pvVar19->m_vectors).m_capacity;
      (pvVar19->m_vectors).m_capacity = (this->m_left_children).m_capacity;
      (this->m_left_children).m_capacity = uVar5;
      pvVar19->m_variance = local_114;
      if ((1 < (pvVar19->m_vectors).m_size) && (0.0 < local_114)) {
        insert_heap(this,uVar4);
      }
      if (pvVar10 != (vq_node *)local_98) {
        lVar12 = 0;
        do {
          (pvVar10->m_centroid).m_s[lVar12] = *(float *)(local_98 + lVar12 * 4);
          lVar12 = lVar12 + 1;
        } while (lVar12 != 6);
      }
      pvVar10->m_total_weight = uVar15;
      puVar7 = (pvVar10->m_vectors).m_p;
      (pvVar10->m_vectors).m_p = (this->m_right_children).m_p;
      (this->m_right_children).m_p = puVar7;
      uVar5 = (pvVar10->m_vectors).m_size;
      (pvVar10->m_vectors).m_size = (this->m_right_children).m_size;
      (this->m_right_children).m_size = uVar5;
      uVar5 = (pvVar10->m_vectors).m_capacity;
      (pvVar10->m_vectors).m_capacity = (this->m_right_children).m_capacity;
      (this->m_right_children).m_capacity = uVar5;
      pvVar10->m_variance = local_118;
      if ((1 < (pvVar10->m_vectors).m_size) && (0.0 < local_118)) {
        insert_heap(this,node_index);
      }
    }
  }
  return;
}

Assistant:

training_vec_array& get_training_vecs()
        {
            return m_training_vecs;
        }